

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O2

string * __thiscall
OutputFile::generateRecursive(string *__return_storage_ptr__,OutputFile *this,string *prefix)

{
  OutputFile *this_00;
  OutputFile *pOVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_d0);
  std::operator+(&local_90,prefix,&this->key);
  std::operator+(&local_70,&local_90,"=");
  std::operator+(&local_b0,&local_70,&this->value);
  std::operator+(&local_d0,&local_b0,&this->eol);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  pOVar1 = this;
  while (pOVar1 = (OutputFile *)
                  (pOVar1->descendants).
                  super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl._M_node.
                  super__List_node_base._M_next, pOVar1 != this) {
    this_00 = (OutputFile *)
              (pOVar1->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>.
              _M_impl._M_node._M_size;
    std::operator+(&local_b0,prefix,&this->key);
    std::operator+(&local_50,&local_b0,&this->keySeparator);
    generateRecursive(&local_d0,this_00,&local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

string
OutputFile::generateRecursive(string prefix) {
  string result = "";

  result += prefix + key + "=" + value + eol;

  for (list<OutputFile*>::iterator it = descendants.begin(); it != descendants.end(); ++it) {
    result += (*it)->generateRecursive(prefix + key + keySeparator);
  }

  return result;
}